

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O2

unique_ptr<flow::lang::CallExpr,_std::default_delete<flow::lang::CallExpr>_> __thiscall
flow::lang::Parser::resolve
          (Parser *this,
          list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *callables,
          ParamList *params)

{
  CallableSym *this_00;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> uVar3;
  undefined8 uVar4;
  bool bVar5;
  Signature *pSVar6;
  ParamList *in_RCX;
  long *plVar7;
  ParamList *pPVar8;
  const_iterator __end2;
  CallableSym *callableSym;
  CallableSym *callee;
  list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> result;
  list<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  matchErrors;
  Signature inputSignature;
  allocator<char> local_159;
  undefined1 local_158 [8];
  undefined1 local_150 [16];
  undefined1 local_140 [32];
  undefined1 local_120 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  Signature local_f0;
  Signature local_b0;
  Signature local_70;
  
  makeSignature(&local_70,*(CallableSym **)(*(long *)params + 0x10),in_RCX);
  pPVar8 = params;
  do {
    pPVar8 = *(ParamList **)pPVar8;
    if (pPVar8 == params) {
      local_120._0_8_ = local_120;
      local_120._16_8_ = 0;
      local_108._M_allocated_capacity = (size_type)(local_120 + 0x18);
      local_f8._M_p = (pointer)0x0;
      pPVar8 = params;
      local_140._16_8_ = callables;
      local_140._24_8_ = this;
      local_120._8_8_ = local_120._0_8_;
      local_108._8_8_ = local_108._M_allocated_capacity;
      while (this = (Parser *)local_140._24_8_, uVar4 = local_140._16_8_,
            pPVar8 = *(ParamList **)pPVar8, pPVar8 != params) {
        local_158 = (undefined1  [8])
                    (pPVar8->names_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        local_150._8_8_ = (pointer)0x0;
        local_140[0] = '\0';
        local_150._0_8_ = (CallableSym *)local_140;
        bVar5 = CallableSym::tryMatch((CallableSym *)local_158,in_RCX,(string *)local_150);
        if (bVar5) {
          std::__cxx11::list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
          ::push_back((list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *
                      )local_120,(value_type *)local_158);
        }
        else {
          std::__cxx11::
          list<std::pair<flow::lang::CallableSym*,std::__cxx11::string>,std::allocator<std::pair<flow::lang::CallableSym*,std::__cxx11::string>>>
          ::emplace_back<flow::lang::CallableSym*&,std::__cxx11::string&>
                    ((list<std::pair<flow::lang::CallableSym*,std::__cxx11::string>,std::allocator<std::pair<flow::lang::CallableSym*,std::__cxx11::string>>>
                      *)(local_120 + 0x18),(CallableSym **)local_158,(string *)local_150);
        }
        std::__cxx11::string::~string((string *)local_150);
      }
      if ((Expr *)local_120._0_8_ == (Expr *)local_120) {
        p_Var1 = (((list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *)
                  (local_140._16_8_ + 0x30))->
                 super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        p_Var2 = (((list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *)
                  (local_140._16_8_ + 0x60))->
                 super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                 )._M_impl._M_node.super__List_node_base._M_prev;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_150,"No matching signature for {}.",(allocator<char> *)local_158)
        ;
        this = (Parser *)local_140._24_8_;
        Signature::Signature(&local_b0,&local_70);
        diagnostics::Report::typeError<flow::Signature>
                  ((Report *)p_Var2,(SourceLocation *)(p_Var1 + 3),(string *)local_150,&local_b0);
        Signature::~Signature(&local_b0);
        std::__cxx11::string::~string((string *)local_150);
        plVar7 = (long *)(local_120 + 0x18);
        while (plVar7 = (long *)*plVar7, plVar7 != (long *)(local_120 + 0x18)) {
          diagnostics::Report::typeError<>
                    ((Report *)
                     (((list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                        *)(uVar4 + 0x60))->
                     super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                     )._M_impl._M_node.super__List_node_base._M_prev,
                     (SourceLocation *)
                     ((((list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                         *)(uVar4 + 0x30))->
                      super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                      )._M_impl._M_node.super__List_node_base._M_next + 3),(string *)(plVar7 + 3));
        }
LAB_001219e2:
        (((CallExpr *)this)->super_Expr).super_ASTNode._vptr_ASTNode = (_func_int **)0x0;
      }
      else {
        if (1 < (ulong)local_120._16_8_) {
          p_Var1 = (((list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *)
                    (local_140._16_8_ + 0x30))->
                   super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                   )._M_impl._M_node.super__List_node_base._M_next;
          p_Var2 = (((list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *)
                    (local_140._16_8_ + 0x60))->
                   super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                   )._M_impl._M_node.super__List_node_base._M_prev;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_150,"Call to builtin is ambiguous.",
                     (allocator<char> *)local_158);
          diagnostics::Report::typeError<>
                    ((Report *)p_Var2,(SourceLocation *)(p_Var1 + 3),(string *)local_150);
          std::__cxx11::string::~string((string *)local_150);
          goto LAB_001219e2;
        }
        uVar3._M_t.super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>.
        _M_t.super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
        super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl =
             *(__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>
               *)(local_120._0_8_ + 0x10);
        local_158 = (undefined1  [8])
                    uVar3._M_t.
                    super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
                    .super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl;
        if (((*(NativeCallback **)
               ((long)uVar3._M_t.
                      super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
                      .super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl + 0x70))->
             attributes_ & 1) != 0) {
          p_Var1 = (((list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *)
                    (local_140._16_8_ + 0x30))->
                   super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                   )._M_impl._M_node.super__List_node_base._M_next;
          p_Var2 = (((list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *)
                    (local_140._16_8_ + 0x60))->
                   super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                   )._M_impl._M_node.super__List_node_base._M_prev;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_150,"Using experimental builtin API {}.",&local_159);
          pSVar6 = NativeCallback::signature
                             (*(NativeCallback **)
                               ((long)uVar3._M_t.
                                      super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
                                      .super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl
                               + 0x70));
          Signature::Signature(&local_f0,pSVar6);
          diagnostics::Report::warning<flow::Signature>
                    ((Report *)p_Var2,(SourceLocation *)(p_Var1 + 3),(string *)local_150,&local_f0);
          Signature::~Signature(&local_f0);
          std::__cxx11::string::~string((string *)local_150);
        }
        std::
        make_unique<flow::lang::CallExpr,flow::SourceLocation&,flow::lang::CallableSym*&,flow::lang::ParamList>
                  ((SourceLocation *)this,
                   (CallableSym **)
                   ((long)uVar3._M_t.
                          super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
                          .super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl + 8),
                   (ParamList *)local_158);
      }
      std::__cxx11::
      _List_base<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_clear((_List_base<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_120 + 0x18));
      std::__cxx11::
      _List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>::_M_clear
                ((_List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                  *)local_120);
      goto LAB_00121b2d;
    }
    this_00 = (CallableSym *)
              (pPVar8->names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_150._0_8_ = this_00;
    bVar5 = CallableSym::isDirectMatch(this_00,in_RCX);
  } while (!bVar5);
  std::
  make_unique<flow::lang::CallExpr,flow::SourceLocation&,flow::lang::CallableSym*&,flow::lang::ParamList>
            ((SourceLocation *)this,(CallableSym **)&(this_00->super_Symbol).super_ASTNode.location_
             ,(ParamList *)local_150);
LAB_00121b2d:
  Signature::~Signature(&local_70);
  return (__uniq_ptr_data<flow::lang::CallExpr,_std::default_delete<flow::lang::CallExpr>,_true,_true>
          )(tuple<flow::lang::CallExpr_*,_std::default_delete<flow::lang::CallExpr>_>)this;
}

Assistant:

std::unique_ptr<CallExpr> Parser::resolve(
    const std::list<CallableSym*>& callables, ParamList&& params) {
  Signature inputSignature = makeSignature(callables.front(), params);

  // attempt to find a full match first
  for (CallableSym* callee : callables) {
    if (callee->isDirectMatch(params)) {
      return std::make_unique<CallExpr>(callee->location(), callee,
                                        std::move(params));
    }
  }

  // attempt to find something with default values or parameter-reordering (if
  // named args)
  std::list<CallableSym*> result;
  std::list<std::pair<CallableSym*, std::string>> matchErrors;

  for (CallableSym* callee : callables) {
    std::string msg;
    if (callee->tryMatch(params, &msg)) {
      result.push_back(callee);
    } else {
      matchErrors.emplace_back(callee, msg);
    }
  }

  if (result.empty()) {
    report_.typeError(lastLocation(), "No matching signature for {}.", inputSignature);
    for (const auto& me : matchErrors) {
      report_.typeError(lastLocation(), me.second);
    }
    return nullptr;
  }

  if (result.size() > 1) {
    report_.typeError(lastLocation(), "Call to builtin is ambiguous.");
    return nullptr;
  }

  CallableSym* callableSym = result.front();

  if (callableSym->nativeCallback()->isExperimental()) {
    report_.warning(lastLocation(),
                    "Using experimental builtin API {}.",
                    callableSym->nativeCallback()->signature());
  }

  return std::make_unique<CallExpr>(callableSym->location(), callableSym,
                                    std::move(params));
}